

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O1

string * __thiscall
cfd::core::JsonClassBase<cfd::api::json::DecodePsbtResponse>::Serialize_abi_cxx11_
          (string *__return_storage_ptr__,JsonClassBase<cfd::api::json::DecodePsbtResponse> *this)

{
  key_type *pkVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  const_iterator cVar4;
  long *plVar5;
  _Any_data *p_Var6;
  _Node *p_Var7;
  size_type *psVar8;
  bool bVar9;
  key_type *__k;
  _List_node_base *p_Var10;
  string item_result;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str_list;
  JsonTableMap<cfd::api::json::DecodePsbtResponse> mapper;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>_>_>_>
  local_60;
  
  (*this->_vptr_JsonClassBase[2])(this);
  local_80 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_80;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar2 = (*this->_vptr_JsonClassBase[9])(this);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>_>_>_>
  ::_Rb_tree(&local_60,
             (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>_>_>_>
              *)CONCAT44(extraout_var,iVar2));
  local_78._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_78;
  local_78._M_impl._M_node._M_size = 0;
  local_78._M_impl._M_node.super__List_node_base._M_prev =
       local_78._M_impl._M_node.super__List_node_base._M_next;
  iVar2 = (*this->_vptr_JsonClassBase[10])(this);
  iVar3 = (*this->_vptr_JsonClassBase[0xb])(this);
  __k = *(key_type **)CONCAT44(extraout_var_00,iVar2);
  pkVar1 = (key_type *)((long *)CONCAT44(extraout_var_00,iVar2))[1];
  if (__k != pkVar1) {
    do {
      cVar4 = ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(extraout_var_01,iVar3),__k);
      if ((_Rb_tree_header *)cVar4._M_node ==
          &(((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT44(extraout_var_01,iVar3))->_M_impl).super__Rb_tree_header) {
        ::std::operator+(&local_c0,"\"",__k);
        plVar5 = (long *)::std::__cxx11::string::append((char *)&local_c0);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_a0.field_2._M_allocated_capacity = *psVar8;
          local_a0.field_2._8_8_ = plVar5[3];
        }
        else {
          local_a0.field_2._M_allocated_capacity = *psVar8;
          local_a0._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_a0._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        p_Var6 = (_Any_data *)
                 ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>_>_>_>
                               *)&local_60,__k);
        if (*(long *)(p_Var6 + 1) == 0) {
          ::std::__throw_bad_function_call();
        }
        (**(code **)((long)p_Var6 + 0x18))(&local_c0,p_Var6,(DecodePsbtResponse *)this);
        ::std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_c0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        p_Var7 = ::std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                 _M_create_node<std::__cxx11::string_const&>
                           ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                            &local_78,&local_a0);
        ::std::__detail::_List_node_base::_M_hook(&p_Var7->super__List_node_base);
        local_78._M_impl._M_node._M_size = local_78._M_impl._M_node._M_size + 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
      }
      __k = __k + 1;
    } while (__k != pkVar1);
  }
  ::std::__cxx11::string::_M_replace
            ((ulong)__return_storage_ptr__,0,(char *)__return_storage_ptr__->_M_string_length,
             0x5ec03a);
  bVar9 = true;
  p_Var10 = (_List_node_base *)&local_78;
  while (p_Var10 = (((_List_impl *)&p_Var10->_M_next)->_M_node).super__List_node_base._M_next,
        p_Var10 != (_List_node_base *)&local_78) {
    if (!bVar9) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    bVar9 = false;
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)p_Var10[1]._M_next);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  (*this->_vptr_JsonClassBase[3])();
  ::std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_78);
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::DecodePsbtResponse>_>_>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Serialize() const {
    PreSerialize();

    std::string result;
    JsonTableMap<TYPE> mapper = GetJsonMapper();
    std::list<std::string> str_list;
    const std::vector<std::string>& key_list = GetJsonItemList();
    const std::set<std::string>& ignore_items = GetIgnoreItem();
    for (const std::string& key : key_list) {
      if (ignore_items.find(key) != ignore_items.end()) {
        continue;
      }
      std::string item_result = "\"" + key + "\":";
      item_result +=
          mapper[key].get_function(*(reinterpret_cast<const TYPE*>(this)));
      str_list.push_back(item_result);
    }

    result = "{";
    bool is_first = true;
    for (const auto& item : str_list) {
      if (!is_first) {
        result += ",";
      }
      result += item;
      is_first = false;
    }
    result += "}";

    PostSerialize();
    return result;
  }